

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CumSumLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_cumsum(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  CumSumLayerParams *pCVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_cumsum(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_cumsum(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pCVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::CumSumLayerParams>(arena);
    (this->layer_).cumsum_ = pCVar2;
  }
  return (CumSumLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CumSumLayerParams* NeuralNetworkLayer::_internal_mutable_cumsum() {
  if (!_internal_has_cumsum()) {
    clear_layer();
    set_has_cumsum();
    layer_.cumsum_ = CreateMaybeMessage< ::CoreML::Specification::CumSumLayerParams >(GetArenaForAllocation());
  }
  return layer_.cumsum_;
}